

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<double,unsigned_long,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong *puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  unsigned_long *key;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  size_t sVar9;
  size_t *psVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  longdouble lVar15;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar16;
  longdouble local_114;
  longdouble local_ec;
  longdouble local_bc;
  longdouble local_b0;
  longdouble local_a4;
  long local_68;
  ushort uStack_60;
  long local_58;
  ushort uStack_50;
  
  uVar8 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  if (uVar8 != uVar2) {
    puVar7 = ix_arr + st;
    local_114 = (longdouble)0;
    for (sVar9 = st; sVar9 <= end; sVar9 = sVar9 + 1) {
      pVar16 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,puVar7);
      local_114 = local_114 + (longdouble)*(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8)
      ;
      puVar7 = puVar7 + 1;
    }
    local_a4 = (longdouble)0;
    if (local_a4 < local_114) {
      puVar7 = Xc_ind + uVar2;
      uVar3 = puVar7[-1];
      psVar10 = ix_arr + end + 1;
      key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                      (ix_arr + st,psVar10,Xc_ind + uVar8);
      if (missing_action == Fail) {
        local_ec = (longdouble)0;
        local_bc = local_ec;
        local_b0 = local_ec;
        local_a4 = local_ec;
        do {
          puVar1 = Xc_ind + uVar8;
          while( true ) {
            if (((key == psVar10) || (uVar8 == uVar2)) || (uVar4 = *key, uVar3 < uVar4))
            goto LAB_0021425b;
            if (*puVar1 == uVar4) break;
            lVar11 = in_ST1;
            lVar12 = in_ST2;
            lVar13 = in_ST3;
            if (*puVar1 <= uVar4) goto LAB_0021420f;
            key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (key + 1,psVar10,puVar1);
          }
          tsl::detail_robin_hash::
          robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
          ::try_emplace<unsigned_long_const&>
                    ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                      *)w,key);
          lVar11 = in_ST4;
          lVar12 = in_ST4;
          lVar13 = in_ST4;
          fmal();
          fmal();
          lVar14 = lVar13;
          fmal();
          fmal();
          local_ec = in_ST0;
          local_bc = in_ST1;
          local_b0 = in_ST2;
          local_a4 = in_ST3;
          if ((key == ix_arr + end) || (uVar8 == uVar2 - 1)) goto LAB_0021425b;
          key = key + 1;
          in_ST0 = in_ST4;
          in_ST4 = lVar14;
LAB_0021420f:
          in_ST3 = lVar13;
          in_ST2 = lVar12;
          in_ST1 = lVar11;
          puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (puVar1 + 1,puVar7,key);
          uVar8 = (long)puVar6 - (long)Xc_ind >> 3;
        } while( true );
      }
      local_ec = (longdouble)0;
      local_bc = local_ec;
      local_b0 = local_ec;
      do {
        puVar1 = Xc_ind + uVar8;
LAB_00213e75:
        if (((key == psVar10) || (uVar8 == uVar2)) || (uVar4 = *key, uVar3 < uVar4)) {
LAB_00214065:
          if (local_114 <= (longdouble)0) {
            return -INFINITY;
          }
LAB_0021425b:
          if (local_114 <= (longdouble)1) {
            return -INFINITY;
          }
          if ((local_bc == (longdouble)0) && (!NAN(local_bc) && !NAN((longdouble)0))) {
            return -INFINITY;
          }
          if ((local_bc == local_ec * local_ec) && (!NAN(local_bc) && !NAN(local_ec * local_ec))) {
            return -INFINITY;
          }
          lVar11 = local_ec / local_114;
          lVar12 = lVar11 * lVar11;
          lVar13 = local_bc / local_114 - lVar12;
          if (NAN(lVar13)) {
            return -INFINITY;
          }
          if ((lVar13 <= (longdouble)2.220446e-16) &&
             (bVar5 = check_more_than_two_unique_values<double,unsigned_long>
                                (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar5))
          {
            return -INFINITY;
          }
          if (lVar13 <= (longdouble)0) {
            return 0.0;
          }
          lVar11 = (lVar12 * lVar11 * lVar11 * local_114 +
                   local_ec * (longdouble)-4.0 * lVar12 * lVar11 +
                   local_bc * (longdouble)6.0 * lVar12 +
                   local_a4 + local_b0 * (longdouble)-4.0 * lVar11) / (lVar13 * lVar13 * local_114);
          local_68 = SUB108(lVar11,0);
          uStack_60 = (ushort)((unkuint10)lVar11 >> 0x40);
          if (((unkuint10)lVar11 & 0x7fff) == 0 ||
              (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
            if ((double)lVar11 <= 0.0) {
              return 0.0;
            }
            return (double)lVar11;
          }
          return -INFINITY;
        }
        if (*puVar1 != uVar4) {
          if (*puVar1 <= uVar4) goto LAB_0021402c;
          key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (key + 1,psVar10,puVar1);
          goto LAB_00213e75;
        }
        pVar16 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::try_emplace<unsigned_long_const&>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,key);
        lVar11 = (longdouble)Xc[uVar8];
        local_58 = SUB108(lVar11,0);
        uStack_50 = (ushort)((unkuint10)lVar11 >> 0x40);
        if ((NAN(Xc[uVar8])) || ((~uStack_50 & 0x7fff) == 0 && local_58 == -0x8000000000000000)) {
          local_114 = local_114 -
                      (longdouble)*(double *)((pVar16.first.m_bucket.m_bucket)->m_value + 8);
          lVar11 = in_ST0;
          lVar12 = in_ST1;
          lVar13 = in_ST2;
          lVar14 = in_ST3;
        }
        else {
          lVar12 = in_ST4;
          lVar13 = in_ST4;
          lVar14 = in_ST4;
          fmal();
          fmal();
          lVar15 = lVar14;
          fmal();
          fmal();
          lVar11 = in_ST4;
          in_ST4 = lVar15;
          local_ec = in_ST0;
          local_bc = in_ST1;
          local_b0 = in_ST2;
          local_a4 = in_ST3;
        }
        in_ST3 = lVar14;
        in_ST2 = lVar13;
        in_ST1 = lVar12;
        in_ST0 = lVar11;
        if ((key == ix_arr + end) || (uVar8 == uVar2 - 1)) goto LAB_00214065;
        key = key + 1;
LAB_0021402c:
        puVar6 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar1 + 1,puVar7,key);
        uVar8 = (long)puVar6 - (long)Xc_ind >> 3;
      } while( true );
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}